

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcg64_shift.hpp
# Opt level: O2

result_type __thiscall trng::lcg64_shift::operator()(lcg64_shift *this)

{
  ulong uVar1;
  
  uVar1 = (this->S).r * (this->P).a + (this->P).b;
  (this->S).r = uVar1;
  uVar1 = uVar1 >> 0x11 ^ uVar1;
  uVar1 = uVar1 << 0x1f ^ uVar1;
  return uVar1 >> 8 ^ uVar1;
}

Assistant:

TRNG_CUDA_ENABLE
  inline lcg64_shift::result_type lcg64_shift::operator()() {
    step();
    result_type t{S.r};
    t ^= (t >> 17u);
    t ^= (t << 31u);
    t ^= (t >> 8u);
    return t;
  }